

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ClockingDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClockingDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::EventExpressionSyntax&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>const&,slang::parsing::Token&,slang::syntax::NamedBlockClauseSyntax*&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,EventExpressionSyntax *args_5,
          Token *args_6,SyntaxList<slang::syntax::MemberSyntax> *args_7,Token *args_8,
          NamedBlockClauseSyntax **args_9)

{
  Token blockName;
  Token at;
  Token endClocking;
  ClockingDeclarationSyntax *this_00;
  Info *in_RCX;
  NamedBlockClauseSyntax *in_RDX;
  undefined8 *in_R8;
  SyntaxList<slang::syntax::MemberSyntax> *in_R9;
  Token *in_stack_00000010;
  Token *in_stack_00000020;
  undefined8 *in_stack_00000028;
  size_t in_stack_fffffffffffffef8;
  size_t in_stack_ffffffffffffff00;
  BumpAllocator *in_stack_ffffffffffffff08;
  
  this_00 = (ClockingDeclarationSyntax *)
            allocate(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  blockName.info = (Info *)*in_R8;
  blockName._0_8_ = *(undefined8 *)&(in_R9->super_SyntaxListBase).super_SyntaxNode;
  at.info = (Info *)in_RCX->rawTextPtr;
  at._0_8_ = in_R8[1];
  endClocking.info = in_RCX;
  endClocking._0_8_ = in_R8;
  slang::syntax::ClockingDeclarationSyntax::ClockingDeclarationSyntax
            (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)*in_stack_00000028,
             *in_stack_00000010,*in_stack_00000020,blockName,at,
             (EventExpressionSyntax *)in_RCX->location,*(Token *)&in_RDX->super_SyntaxNode,in_R9,
             endClocking,in_RDX);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }